

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int buffer_read_bi16(buffer_t *buffer,int16_t *data)

{
  bool bVar1;
  
  bVar1 = buffer->size < buffer->cursor + 2;
  if (!bVar1) {
    *data = *(ushort *)(buffer->data + buffer->cursor) << 8 |
            *(ushort *)(buffer->data + buffer->cursor) >> 8;
  }
  return (uint)bVar1;
}

Assistant:

int
buffer_read(buffer_t *buffer, void *data, size_t size)
{
    if (buffer->cursor + size > buffer->size) {
        return 1;
    }

    memcpy(data, &buffer->data[buffer->cursor], size);
    return 0;
}